

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__decode_jpeg_image(stbi__jpeg *j)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi__uint32 sVar4;
  stbi__uint32 NL;
  int Ld;
  int x;
  int m;
  stbi__jpeg *j_local;
  
  for (Ld = 0; Ld < 4; Ld = Ld + 1) {
    j->img_comp[Ld].raw_data = (void *)0x0;
    j->img_comp[Ld].raw_coeff = (void *)0x0;
  }
  j->restart_interval = 0;
  iVar3 = stbi__decode_jpeg_header(j,0);
  if (iVar3 == 0) {
    j_local._4_4_ = 0;
  }
  else {
    bVar1 = stbi__get_marker(j);
    while (Ld = (int)bVar1, Ld != 0xd9) {
      if (Ld == 0xda) {
        iVar3 = stbi__process_scan_header(j);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = stbi__parse_entropy_coded_data(j);
        if (iVar3 == 0) {
          return 0;
        }
        if (j->marker == 0xff) {
          do {
            iVar3 = stbi__at_eof(j->s);
            if (iVar3 != 0) goto LAB_0011e074;
            sVar2 = stbi__get8(j->s);
          } while (sVar2 != 0xff);
          sVar2 = stbi__get8(j->s);
          j->marker = sVar2;
        }
      }
      else if (Ld == 0xdc) {
        iVar3 = stbi__get16be(j->s);
        sVar4 = stbi__get16be(j->s);
        if (iVar3 != 4) {
          iVar3 = stbi__err("bad DNL len");
          return iVar3;
        }
        if (sVar4 != j->s->img_y) {
          iVar3 = stbi__err("bad DNL height");
          return iVar3;
        }
      }
      else {
        iVar3 = stbi__process_marker(j,Ld);
        if (iVar3 == 0) {
          return 0;
        }
      }
LAB_0011e074:
      bVar1 = stbi__get_marker(j);
    }
    if (j->progressive != 0) {
      stbi__jpeg_finish(j);
    }
    j_local._4_4_ = 1;
  }
  return j_local._4_4_;
}

Assistant:

static int stbi__decode_jpeg_image(stbi__jpeg *j)
{
    int m;
    for (m = 0; m < 4; m++)
    {
        j->img_comp[m].raw_data = NULL;
        j->img_comp[m].raw_coeff = NULL;
    }
    j->restart_interval = 0;
    if (!stbi__decode_jpeg_header(j, STBI__SCAN_load)) return 0;
    m = stbi__get_marker(j);
    while (!stbi__EOI(m))
    {
        if (stbi__SOS(m))
        {
            if (!stbi__process_scan_header(j)) return 0;
            if (!stbi__parse_entropy_coded_data(j)) return 0;
            if (j->marker == STBI__MARKER_none)
            {
                // handle 0s at the end of image data from IP Kamera 9060
                while (!stbi__at_eof(j->s))
                {
                    int x = stbi__get8(j->s);
                    if (x == 255)
                    {
                        j->marker = stbi__get8(j->s);
                        break;
                    }
                }
                // if we reach eof without hitting a marker, stbi__get_marker() below will fail and we'll eventually return 0
            }
        } else if (stbi__DNL(m))
        {
            int Ld = stbi__get16be(j->s);
            stbi__uint32 NL = stbi__get16be(j->s);
            if (Ld != 4) return stbi__err("bad DNL len", "Corrupt JPEG");
            if (NL != j->s->img_y) return stbi__err("bad DNL height", "Corrupt JPEG");
        } else
        {
            if (!stbi__process_marker(j, m)) return 0;
        }
        m = stbi__get_marker(j);
    }
    if (j->progressive)
        stbi__jpeg_finish(j);
    return 1;
}